

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void av1_get_one_pass_rt_params
               (AV1_COMP *cpi,FRAME_TYPE *frame_type,EncodeFrameInput *frame_input,uint frame_flags)

{
  aom_tune_content aVar1;
  RESIZE_STATE RVar2;
  aom_rc_mode aVar3;
  AV1_PRIMARY *pAVar4;
  YV12_BUFFER_CONFIG *pYVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  SequenceHeader *pSVar7;
  uint64_t uVar8;
  LAYER_CONTEXT *pLVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  FrameDimensionCfg *pFVar13;
  AV1_COMP *pAVar14;
  int iVar15;
  uint uVar16;
  uint64_t *puVar17;
  ulong uVar18;
  long lVar19;
  _Bool _Var20;
  sbyte sVar21;
  uint uVar22;
  int *piVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  RESIZE_STATE RVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  uint8_t *puVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  uint8_t *puVar37;
  long lVar38;
  int iVar39;
  uchar *puVar40;
  byte *pbVar41;
  int *piVar42;
  double dVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined8 in_stack_fffffffffffffed0;
  uint local_114;
  YV12_BUFFER_CONFIG *local_110;
  long local_108;
  AV1_PRIMARY *local_100;
  AV1_COMP *local_f8;
  int best_intmv_col;
  double local_e8;
  undefined8 uStack_e0;
  long local_d0;
  byte *local_c8;
  ulong local_c0;
  uchar *local_b8;
  uint local_b0;
  int local_ac;
  int local_a8;
  int row_max;
  EncodeFrameInput *local_a0;
  YV12_BUFFER_CONFIG *local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  uint local_34;
  
  local_100 = cpi->ppi;
  iVar15 = (cpi->svc).spatial_layer_id;
  iVar39 = (cpi->svc).number_temporal_layers;
  iVar35 = (cpi->svc).temporal_layer_id;
  iVar34 = (cpi->oxcf).rc_cfg.max_consec_drop_ms;
  local_c8 = frame_type;
  local_a0 = frame_input;
  if (0 < iVar34) {
    local_e8 = cpi->framerate;
    uStack_e0 = 0;
    dVar43 = round(local_e8);
    in_stack_fffffffffffffed0 = 0x203ba8;
    dVar43 = ceil(((double)((ulong)dVar43 & -(ulong)(1.0 < local_e8) |
                           ~-(ulong)(1.0 < local_e8) & (ulong)local_e8) * (double)iVar34) / 1000.0);
    uVar44 = 0xffc00000;
    uVar45 = 0x41dfffff;
    if (dVar43 <= 2147483647.0) {
      uVar44 = SUB84(dVar43,0);
      uVar45 = (undefined4)((ulong)dVar43 >> 0x20);
    }
    (cpi->rc).max_consec_drop = (int)(double)CONCAT44(uVar45,uVar44);
  }
  if (local_100->use_svc != 0) {
    av1_update_temporal_layer_framerate(cpi);
    in_stack_fffffffffffffed0 = 0x203be2;
    av1_restore_layer_context(cpi);
  }
  pbVar41 = local_c8;
  lVar38 = (long)iVar39 * (long)iVar15 + (long)iVar35;
  if (((((cpi->ppi->rtc_ref).set_ref_frame_config == 0) || ((cpi->svc).number_temporal_layers != 1))
      || ((cpi->svc).number_spatial_layers != 1)) ||
     ((cpi->ppi->rtc_ref).reference_was_previous_frame != true)) {
LAB_00203c2b:
    _Var20 = false;
  }
  else {
    in_stack_fffffffffffffed0 = 0x203c1d;
    iVar15 = av1_svc_get_min_ref_dist(cpi);
    _Var20 = true;
    if (iVar15 + 0x80000001U < 0x80000006) goto LAB_00203c2b;
  }
  pAVar4 = cpi->ppi;
  (pAVar4->rtc_ref).bias_recovery_frame = _Var20;
  if (((frame_flags & 1) == 0) && ((cpi->common).current_frame.frame_number != 0)) {
    if (pAVar4->use_svc == 0) {
      if ((cpi->oxcf).kf_cfg.auto_key == true) {
        uVar22 = (cpi->rc).frames_to_key;
joined_r0x00203c99:
        if (uVar22 == 0) goto LAB_00203d10;
      }
    }
    else if (((cpi->svc).spatial_layer_id == 0) && ((cpi->oxcf).kf_cfg.auto_key == true)) {
      uVar22 = (cpi->oxcf).kf_cfg.key_freq_max;
      if (uVar22 != 0) {
        uVar22 = (cpi->svc).current_superframe % uVar22;
        goto joined_r0x00203c99;
      }
      goto LAB_00203d10;
    }
    *pbVar41 = 1;
    (local_100->gf_group).update_type[cpi->gf_frame_index] = '\x01';
    (local_100->gf_group).frame_type[cpi->gf_frame_index] = '\x01';
    (local_100->gf_group).refbuf_state[cpi->gf_frame_index] = '\x01';
    pAVar4 = cpi->ppi;
    if (pAVar4->use_svc != 0) {
      pLVar9 = (cpi->svc).layer_context;
      if ((cpi->svc).spatial_layer_id == 0) {
        iVar15 = 0;
      }
      else {
        iVar15 = pLVar9[(cpi->svc).temporal_layer_id].is_key_frame;
      }
      pLVar9[(int)lVar38].is_key_frame = iVar15;
    }
    if ((pAVar4->rtc_ref).set_ref_frame_config != 0) {
      lVar32 = 0;
      do {
        if ((pAVar4->rtc_ref).reference[lVar32] != 0) goto LAB_00203e09;
        lVar32 = lVar32 + 1;
      } while (lVar32 != 7);
      *pbVar41 = 2;
    }
  }
  else {
LAB_00203d10:
    *pbVar41 = 0;
    if ((cpi->common).current_frame.frame_number == 0) {
      uVar22 = 0;
    }
    else {
      uVar22 = (uint)((cpi->rc).frames_to_key == 0);
    }
    (local_100->p_rc).this_key_frame_forced = uVar22;
    (cpi->rc).frames_to_key = (cpi->oxcf).kf_cfg.key_freq_max;
    (local_100->p_rc).kf_boost = 0x8fc;
    (local_100->gf_group).update_type[cpi->gf_frame_index] = '\0';
    (local_100->gf_group).frame_type[cpi->gf_frame_index] = '\0';
    (local_100->gf_group).refbuf_state[cpi->gf_frame_index] = '\0';
    if (cpi->ppi->use_svc != 0) {
      if ((cpi->common).current_frame.frame_number != 0) {
        in_stack_fffffffffffffed0 = 0x203da2;
        av1_svc_reset_temporal_layers(cpi,1);
      }
      (cpi->svc).layer_context[lVar38].is_key_frame = 1;
    }
    (cpi->rc).frame_number_encoded = 0;
    (cpi->ppi->rtc_ref).non_reference_frame = 0;
    (cpi->rc).static_since_last_scene_change = 0;
  }
LAB_00203e09:
  local_f8 = cpi;
  if (((cpi->active_map).enabled == 0) || ((cpi->rc).percent_blocks_inactive != 100)) {
    if (((cpi->sf).rt_sf.check_scene_detection != 0) && ((cpi->svc).spatial_layer_id == 0)) {
      if (((cpi->rc).prev_coded_width == (cpi->common).width) &&
         ((cpi->rc).prev_coded_height == (cpi->common).height)) {
        pYVar5 = local_a0->source;
        pYVar6 = local_a0->last_source;
        pFVar13 = &(cpi->oxcf).frm_dim_cfg;
        piVar42 = &(cpi->oxcf).frm_dim_cfg.height;
        if ((cpi->svc).number_spatial_layers < 2) {
          piVar42 = &(cpi->common).height;
          pFVar13 = (FrameDimensionCfg *)&(cpi->common).width;
        }
        iVar15 = *piVar42;
        local_e8 = (double)CONCAT44(local_e8._4_4_,pFVar13->width);
        if ((pFVar13->width != (cpi->common).render_width) ||
           ((pYVar6 == (YV12_BUFFER_CONFIG *)0x0 || pYVar5 == (YV12_BUFFER_CONFIG *)0x0) ||
            iVar15 != (cpi->common).render_height)) {
          in_stack_fffffffffffffed0 = 0x203f0b;
          aom_free(cpi->src_sad_blk_64x64);
          cpi->src_sad_blk_64x64 = (uint64_t *)0x0;
        }
        if (pYVar6 != (YV12_BUFFER_CONFIG *)0x0 && pYVar5 != (YV12_BUFFER_CONFIG *)0x0) {
          if (((pYVar5->field_0).field_0.y_width != (pYVar6->field_0).field_0.y_width) ||
             ((pYVar5->field_1).field_0.y_height != (pYVar6->field_1).field_0.y_height))
          goto LAB_00204375;
          puVar33 = (pYVar5->field_5).buffers[0];
          iVar39 = (pYVar5->field_4).field_0.y_stride;
          puVar37 = (pYVar6->field_5).buffers[0];
          local_108 = CONCAT44(local_108._4_4_,(pYVar6->field_4).field_0.y_stride);
          (cpi->rc).high_source_sad = 0;
          (cpi->rc).percent_blocks_with_motion = 0;
          (cpi->rc).max_block_source_sad = 0;
          (cpi->rc).prev_avg_source_sad = (cpi->rc).avg_source_sad;
          piVar42 = &(cpi->svc).mi_cols_full_resoln;
          piVar23 = &(cpi->svc).mi_rows_full_resoln;
          if ((cpi->svc).number_spatial_layers < 2) {
            piVar23 = &(cpi->common).mi_params.mi_rows;
            piVar42 = &(cpi->common).mi_params.mi_cols;
          }
          aVar1 = (cpi->oxcf).tune_cfg.content;
          uVar22 = 10000;
          if (aVar1 == AOM_CONTENT_SCREEN) {
            uVar22 = 8000;
          }
          if ((((cpi->sf).rt_sf.higher_thresh_scene_detection != 0) &&
              (uVar22 = 100000, (cpi->common).height * (cpi->common).width < 0x12c01)) &&
             (uVar22 = 100000, cpi->framerate <= 10.0 && cpi->framerate != 10.0)) {
            uVar22 = 50000;
          }
          if ((0x12c00 < (cpi->common).height * (cpi->common).width) ||
             (local_88 = 5, 10.0 < cpi->framerate || cpi->framerate == 10.0)) {
            local_88 = (ulong)(aVar1 != AOM_CONTENT_SCREEN) + 5;
          }
          pSVar7 = (cpi->common).seq_params;
          iVar34 = pSVar7->mib_size >> (pSVar7->sb_size == BLOCK_128X128);
          uVar16 = (*piVar42 + iVar34 + -1) / iVar34;
          iVar34 = (*piVar23 + iVar34 + -1) / iVar34;
          iVar35 = -1;
          if ((cpi->rc).prev_frame_is_dropped == 0) {
            iVar35 = -(uint)(1 < (cpi->svc).number_temporal_layers);
          }
          local_110 = pYVar5;
          local_d0 = lVar38;
          local_98 = pYVar6;
          if (((local_e8._0_4_ == (cpi->common).render_width) &&
              (iVar15 == (cpi->common).render_height)) &&
             (cpi->src_sad_blk_64x64 == (uint64_t *)0x0)) {
            in_stack_fffffffffffffed0 = 0x2040dd;
            puVar17 = (uint64_t *)aom_calloc((long)(int)(iVar34 * uVar16),8);
            cpi->src_sad_blk_64x64 = puVar17;
            if (puVar17 == (uint64_t *)0x0) {
              in_stack_fffffffffffffed0 = 0x204106;
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate cpi->src_sad_blk_64x64");
            }
          }
          uVar24 = iVar35 + iVar34;
          if ((int)uVar24 < 1) {
            uVar24 = 0;
            uVar36 = 0;
            iVar15 = 0;
          }
          else {
            local_ac = (cpi->common).mi_params.mi_rows;
            uVar30 = (cpi->common).mi_params.mi_cols;
            local_50 = (ulong)uVar30;
            puVar40 = (cpi->active_map).map;
            local_c0 = (ulong)uVar16;
            local_68 = (long)(int)((iVar39 - uVar16) * 0x40);
            local_70 = (long)(int)(((int)local_108 - uVar16) * 0x40);
            local_80 = (ulong)(uVar30 << 4);
            local_48 = (ulong)(uVar30 * 4);
            lVar38 = 0;
            uVar25 = 0;
            iVar15 = 0;
            uVar36 = 0;
            local_b8 = puVar40;
            local_b0 = uVar22;
            local_90 = (ulong)uVar24;
            local_78 = (ulong)uVar24;
            do {
              local_60 = uVar25;
              local_58 = lVar38;
              if (0 < (int)uVar16) {
                local_a8 = local_ac + (int)uVar25 * -0x10;
                row_max = 0x10;
                if (local_a8 < 0x10) {
                  row_max = local_a8;
                }
                bVar11 = 0 < local_a8;
                local_40 = uVar25 * local_c0;
                uVar25 = 0;
                do {
                  local_e8 = (double)CONCAT44(local_e8._4_4_,iVar15);
                  if (((cpi->active_map).enabled == 0) || ((cpi->rc).percent_blocks_inactive < 1)) {
LAB_00204284:
                    in_stack_fffffffffffffed0 = 0x2042a7;
                    uVar22 = (*cpi->ppi->fn_ptr[0xc].sdf)(puVar33,iVar39,puVar37,(int)local_108);
                    uVar18 = (ulong)uVar22;
                  }
                  else {
                    bVar10 = bVar11;
                    if (0 < local_a8) {
                      iVar35 = (int)local_50 + (int)uVar25 * -0x10;
                      iVar15 = 0x10;
                      if (iVar35 < 0x10) {
                        iVar15 = iVar35;
                      }
                      iVar34 = 0;
                      bVar10 = true;
                      lVar32 = lVar38;
                      do {
                        if (0 < iVar35) {
                          lVar19 = 0;
                          do {
                            if (puVar40[(int)lVar32 + (int)lVar19] == '\0') goto LAB_0020427b;
                            lVar19 = lVar19 + 4;
                          } while (lVar19 < iVar15);
                        }
                        iVar34 = iVar34 + 4;
                        lVar32 = lVar32 + local_48;
                        bVar10 = iVar34 < row_max;
                      } while (iVar34 < row_max);
                    }
LAB_0020427b:
                    if (bVar10) goto LAB_00204284;
                    uVar18 = 0;
                  }
                  if (cpi->src_sad_blk_64x64 != (uint64_t *)0x0) {
                    cpi->src_sad_blk_64x64[uVar25 + local_40] = uVar18;
                  }
                  iVar15 = local_e8._0_4_ + (uint)(uVar18 == 0);
                  if ((cpi->rc).max_block_source_sad < uVar18) {
                    (cpi->rc).max_block_source_sad = uVar18;
                  }
                  uVar36 = uVar36 + uVar18;
                  puVar33 = puVar33 + 0x40;
                  puVar37 = puVar37 + 0x40;
                  uVar25 = uVar25 + 1;
                  lVar38 = lVar38 + 0x10;
                  puVar40 = local_b8;
                } while (uVar25 != local_c0);
              }
              puVar37 = puVar37 + local_70;
              puVar33 = puVar33 + local_68;
              uVar25 = local_60 + 1;
              lVar38 = local_58 + local_80;
            } while (uVar25 != local_78);
            uVar24 = 0;
            if (0 < (int)uVar16) {
              uVar24 = uVar16;
            }
            uVar24 = (int)local_90 * uVar24;
            uVar22 = local_b0;
          }
          pAVar14 = local_f8;
          if (0 < (int)uVar24) {
            uVar36 = uVar36 / uVar24;
          }
          uVar8 = (cpi->rc).avg_source_sad;
          uVar16 = (int)local_88 * (int)uVar8;
          if (uVar16 < uVar22) {
            uVar16 = uVar22;
          }
          if (((uVar16 < uVar36) &&
              ((cpi->svc).number_spatial_layers + 1 < (cpi->rc).frames_since_key)) &&
             (SBORROW4(iVar15,((int)uVar24 >> 2) * 3) != iVar15 + ((int)uVar24 >> 2) * -3 < 0)) {
            iVar35 = 1;
            bVar11 = false;
          }
          else {
            iVar35 = 0;
            bVar11 = true;
          }
          uVar25 = uVar8 * 3 + uVar36;
          (cpi->rc).high_source_sad = iVar35;
          (cpi->rc).avg_source_sad = uVar25 >> 2;
          (cpi->rc).frame_source_sad = uVar36;
          if (0 < (int)uVar24) {
            (cpi->rc).percent_blocks_with_motion = (int)((uVar24 - iVar15) * 100) / (int)uVar24;
          }
          if (uVar36 != 0) {
            (cpi->rc).static_since_last_scene_change = 0;
          }
          if (!bVar11) {
            (cpi->rc).frames_since_scene_change = 0;
            (cpi->rc).static_since_last_scene_change = 1;
          }
          if (((cpi->svc).temporal_layer_id == 0) && ((cpi->rc).drop_count_consec < 3)) {
            (cpi->rc).high_motion_content_screen_rtc = 0;
            if ((((10 < (cpi->oxcf).speed) &&
                 (((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN &&
                  (0x28 < (cpi->rc).percent_blocks_with_motion)))) && (0x24003 < uVar25)) &&
               ((((0x9000 < (cpi->rc).prev_avg_source_sad && ((cpi->rc).avg_frame_low_motion < 0x3c)
                  ) && (0x4ff < (local_110->field_0).field_0.y_width)) &&
                ((0x2cf < (local_110->field_1).field_0.y_height &&
                 ((cpi->rc).high_motion_content_screen_rtc = 1,
                 ((cpi->common).seq_params)->bit_depth == AOM_BITS_8)))))) {
              uVar22 = 0xc0;
              if (20000 < uVar36) {
                uVar22 = 0x200;
              }
              piVar42 = (int *)0xa0;
              if (20000 < uVar36) {
                piVar42 = (int *)0x200;
              }
              local_e8 = (double)CONCAT44(local_e8._4_4_,
                                          (local_110->field_1).field_0.y_height *
                                          (local_110->field_0).field_0.y_width);
              uVar16 = 0;
              do {
                if (uVar16 == 2) {
                  sVar21 = 2;
                  iVar15 = 3;
                }
                else if (uVar16 == 1) {
                  sVar21 = 2;
                  iVar15 = 1;
                }
                else {
                  iVar15 = 1;
                  sVar21 = 1;
                }
                iVar35 = (local_110->field_0).field_0.y_width;
                iVar34 = (local_110->field_1).field_0.y_height;
                uVar30 = (iVar35 * iVar15 >> sVar21) - 0x40;
                uVar24 = iVar35 + ~(uint)piVar42;
                if ((int)uVar24 < (int)uVar30) {
                  uVar30 = uVar24;
                }
                piVar23 = piVar42;
                if ((int)(uint)piVar42 <= (int)uVar30) {
                  piVar23 = (int *)(ulong)uVar30;
                }
                uVar24 = (iVar15 * iVar34 >> sVar21) - 0x40;
                if ((int)(iVar34 + ~uVar22) < (int)uVar24) {
                  uVar24 = iVar34 + ~uVar22;
                }
                uVar30 = uVar22;
                if ((int)uVar22 <= (int)uVar24) {
                  uVar30 = uVar24;
                }
                if (((int)piVar23 < iVar35 + -0x40) && ((int)uVar30 < iVar34 + -0x40)) {
                  best_intmv_col = 0;
                  local_114 = 0;
                  uVar30 = estimate_scroll_motion
                                     (local_f8,(local_110->field_5).buffers[0] +
                                               (int)(uVar30 * iVar39) + (long)piVar23,
                                      (local_98->field_5).buffers[0] +
                                      (int)(uVar30 * (int)local_108) + (long)piVar23,iVar39,
                                      (int)local_108,(BLOCK_SIZE)piVar23,uVar30,(int)&best_intmv_col
                                      ,(int *)&local_114,piVar42,uVar22,
                                      (int)in_stack_fffffffffffffed0);
                  uVar24 = -best_intmv_col;
                  if (0 < best_intmv_col) {
                    uVar24 = best_intmv_col;
                  }
                  uVar31 = 300;
                  if (uVar24 < 0x97) {
                    uVar28 = -local_114;
                    if (0 < (int)local_114) {
                      uVar28 = local_114;
                    }
                    if (uVar28 < 0x97) {
                      uVar31 = 0x96;
                    }
                  }
                  bVar11 = true;
                  iVar15 = 0;
                  if (uVar30 < uVar31) {
                    if (uVar24 < 0x11) {
                      uVar24 = -local_114;
                      if (0 < (int)local_114) {
                        uVar24 = local_114;
                      }
                      iVar15 = 0;
                      if (uVar24 < 0x11) goto LAB_00204cbf;
                    }
                    (local_f8->rc).high_motion_content_screen_rtc = 0;
                    iVar15 = 10;
                    bVar11 = false;
                  }
LAB_00204cbf:
                  if (bVar11) goto LAB_00204cc4;
                }
                else {
LAB_00204cc4:
                  iVar15 = 0;
                }
                cpi = pAVar14;
              } while (((iVar15 == 0) && (0x1fa3ff < local_e8._0_4_)) &&
                      (bVar11 = uVar16 < 2, uVar16 = uVar16 + 1, bVar11));
            }
            uVar22 = (cpi->svc).number_spatial_layers;
            if ((1 < (int)uVar22) || ((uVar22 == 1 && (1 < (cpi->svc).number_temporal_layers)))) {
              uVar16 = (cpi->svc).number_temporal_layers;
              uVar36 = 1;
              if (1 < (int)uVar22) {
                uVar36 = (ulong)uVar22;
              }
              lVar38 = (ulong)uVar16 * 0x3380;
              lVar32 = 0x33c4;
              uVar25 = 0;
              do {
                if (1 < (int)uVar16) {
                  pLVar9 = (cpi->svc).layer_context;
                  lVar19 = 0;
                  do {
                    *(int *)((long)&(pLVar9->rc).base_frame_target + lVar19 + lVar32) =
                         (cpi->rc).high_motion_content_screen_rtc;
                    lVar19 = lVar19 + 0x3380;
                  } while (lVar38 + -0x3380 != lVar19);
                }
                uVar25 = uVar25 + 1;
                lVar32 = lVar32 + lVar38;
              } while (uVar25 != uVar36);
            }
          }
          lVar32 = (long)(cpi->svc).number_spatial_layers;
          lVar38 = local_d0;
          pbVar41 = local_c8;
          if (1 < lVar32) {
            iVar15 = (cpi->svc).number_temporal_layers;
            piVar42 = &(cpi->svc).layer_context[(cpi->svc).temporal_layer_id].rc.high_source_sad;
            do {
              *piVar42 = (cpi->rc).high_source_sad;
              *(uint64_t *)(piVar42 + 6) = (cpi->rc).frame_source_sad;
              *(uint64_t *)(piVar42 + 2) = (cpi->rc).avg_source_sad;
              piVar42[0x28] = (cpi->rc).percent_blocks_with_motion;
              *(uint64_t *)(piVar42 + 0x2a) = (cpi->rc).max_block_source_sad;
              piVar42 = piVar42 + (long)iVar15 * 0xce0;
              lVar32 = lVar32 + -1;
            } while (lVar32 != 0);
          }
        }
      }
      else {
LAB_00204375:
        aom_free(cpi->src_sad_blk_64x64);
        cpi->src_sad_blk_64x64 = (uint64_t *)0x0;
      }
    }
  }
  else {
    (cpi->rc).frame_source_sad = 0;
    (cpi->rc).avg_source_sad = (cpi->rc).avg_source_sad * 3 >> 2;
    (cpi->rc).percent_blocks_with_motion = 0;
    (cpi->rc).high_source_sad = 0;
  }
  if ((((*pbVar41 == 0) && ((cpi->sf).rt_sf.rc_adjust_keyframe != 0)) ||
      (((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0 && ((cpi->rc).high_source_sad != 0)))) &&
     ((((cpi->svc).spatial_layer_id == 0 &&
       (pSVar7 = (cpi->common).seq_params, pSVar7->bit_depth == AOM_BITS_8)) &&
      ((cpi->oxcf).rc_cfg.max_intra_bitrate_pct != 0)))) {
    puVar33 = (local_a0->source->field_5).buffers[0];
    iVar15 = (local_a0->source->field_4).field_0.y_stride;
    iVar39 = (cpi->common).mi_params.mi_rows;
    iVar35 = (cpi->common).mi_params.mi_cols;
    (cpi->rc).perc_spatial_flat_blocks = 0;
    iVar34 = pSVar7->mib_size >> (pSVar7->sb_size == BLOCK_128X128);
    uVar36 = (long)(iVar35 + iVar34 + -1) / (long)iVar34;
    iVar34 = (iVar39 + iVar34 + -1) / iVar34;
    local_d0 = lVar38;
    if (iVar34 < 1) {
      iVar39 = 0;
      uVar22 = 0;
      dVar43 = 0.0;
    }
    else {
      iVar35 = (int)uVar36;
      local_108 = (long)((iVar15 - iVar35) * 0x40);
      uVar25 = 0;
      dVar43 = 0.0;
      iVar39 = 0;
      local_b8 = (uchar *)CONCAT44(local_b8._4_4_,iVar34);
      do {
        uVar18 = uVar36 & 0xffffffff;
        local_c0 = uVar25;
        if (0 < iVar35) {
          do {
            local_e8 = dVar43;
            uVar22 = (*local_f8->ppi->fn_ptr[0xc].vf)(puVar33,iVar15,AV1_VAR_OFFS,0,&local_34);
            dVar43 = (double)((long)local_e8 + (ulong)uVar22);
            iVar39 = iVar39 + (uint)(uVar22 == 0);
            puVar33 = puVar33 + 0x40;
            uVar22 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar22;
          } while (uVar22 != 0);
        }
        puVar33 = puVar33 + local_108;
        uVar22 = (int)local_c0 + 1;
        uVar25 = (ulong)uVar22;
      } while (uVar22 != (uint)local_b8);
      iVar15 = 0;
      if (0 < iVar35) {
        iVar15 = iVar35;
      }
      uVar22 = (uint)local_b8 * iVar15;
      iVar39 = iVar39 * 100;
      cpi = local_f8;
    }
    if (0 < (int)uVar22) {
      (cpi->rc).perc_spatial_flat_blocks = iVar39 / (int)uVar22;
      dVar43 = (double)((ulong)dVar43 / (ulong)uVar22);
    }
    (cpi->rc).frame_spatial_variance = (ulong)dVar43 >> 0xc;
    lVar38 = local_d0;
    pbVar41 = local_c8;
  }
  if ((cpi->oxcf).resize_cfg.resize_mode == '\x03') {
    if (((cpi->svc).number_spatial_layers == 1) && ((cpi->svc).temporal_layer_id == 0)) {
      if ((cpi->common).current_frame.frame_type == '\0') {
        (cpi->rc).resize_avg_qp = 0;
        (cpi->rc).resize_buffer_underflow = 0;
        (cpi->rc).resize_count = 0;
      }
      else {
        iVar15 = (cpi->common).width;
        iVar39 = (cpi->common).height;
        dVar43 = cpi->framerate;
        iVar35 = 0;
        if (dVar43 < (double)(cpi->rc).frames_since_key) {
          pAVar4 = cpi->ppi;
          iVar34 = 0x1e;
          if ((int)(dVar43 + dVar43) < 0x1e) {
            iVar34 = (int)(dVar43 + dVar43);
          }
          iVar26 = (cpi->rc).resize_avg_qp + (pAVar4->p_rc).last_q[1];
          (cpi->rc).resize_avg_qp = iVar26;
          auVar12 = SEXT816((pAVar4->p_rc).optimal_buffer_level * 0x1e) *
                    ZEXT816(0xa3d70a3d70a3d70b);
          if ((pAVar4->p_rc).buffer_level <
              (long)((int)(auVar12._8_8_ >> 6) - (auVar12._12_4_ >> 0x1f))) {
            piVar42 = &(cpi->rc).resize_buffer_underflow;
            *piVar42 = *piVar42 + 1;
          }
          iVar29 = (cpi->rc).resize_count + 1;
          (cpi->rc).resize_count = iVar29;
          iVar35 = 0;
          if (iVar34 <= iVar29) {
            iVar26 = iVar26 / iVar29;
            RVar2 = (cpi->rc).resize_state;
            if ((iVar39 * iVar15 < 0x63d8) || ((cpi->rc).resize_buffer_underflow <= iVar29 >> 2)) {
              iVar35 = 0;
              if ((RVar2 != ORIG) &&
                 (iVar34 = (cpi->rc).worst_quality, iVar26 < (iVar34 * 0x46) / 100)) {
                RVar27 = ORIG;
                iVar35 = -2;
                if ((RVar2 != THREE_QUARTER) && (iVar34 / 2 <= iVar26)) {
                  if (RVar2 != ONE_HALF) goto LAB_00204917;
                  iVar35 = -1;
                  RVar27 = THREE_QUARTER;
                }
                goto LAB_00204927;
              }
            }
            else {
              if (RVar2 == THREE_QUARTER) {
                RVar27 = ONE_HALF;
                iVar35 = 2;
              }
              else {
                if (RVar2 != ORIG) {
LAB_00204917:
                  iVar35 = 0;
                  goto LAB_0020492d;
                }
                RVar27 = THREE_QUARTER;
                iVar35 = 1;
              }
LAB_00204927:
              (cpi->rc).resize_state = RVar27;
            }
LAB_0020492d:
            (cpi->rc).resize_avg_qp = 0;
            (cpi->rc).resize_buffer_underflow = 0;
            (cpi->rc).resize_count = 0;
          }
        }
        if (iVar35 != 0) {
          uVar22 = iVar35 + 1;
          iVar35 = 1;
          iVar34 = 1;
          if (uVar22 < 4) {
            iVar35 = (&DAT_004ff100)[uVar22];
            iVar34 = (&DAT_004ff110)[uVar22];
          }
          resize_reset_rc(cpi,((cpi->oxcf).frm_dim_cfg.width * iVar35) / iVar34,
                          ((cpi->oxcf).frm_dim_cfg.height * iVar35) / iVar34,iVar15,iVar39);
        }
      }
    }
    RVar2 = (cpi->rc).resize_state;
    iVar15 = (cpi->oxcf).frm_dim_cfg.width;
    if (RVar2 == ONE_HALF) {
      (cpi->resize_pending_params).width = iVar15 + 1 >> 1;
      iVar15 = (cpi->oxcf).frm_dim_cfg.height + 1 >> 1;
    }
    else if (RVar2 == THREE_QUARTER) {
      (cpi->resize_pending_params).width = iVar15 * 3 + 3 >> 2;
      iVar15 = (cpi->oxcf).frm_dim_cfg.height * 3 + 3 >> 2;
    }
    else {
      (cpi->resize_pending_params).width = iVar15;
      iVar15 = (cpi->oxcf).frm_dim_cfg.height;
    }
    (cpi->resize_pending_params).height = iVar15;
  }
  else {
    iVar15 = (cpi->resize_pending_params).width;
    if (((iVar15 != 0) && (iVar39 = (cpi->resize_pending_params).height, iVar39 != 0)) &&
       (((cpi->common).width != iVar15 || ((cpi->common).height != iVar39)))) {
      resize_reset_rc(cpi,iVar15,(cpi->resize_pending_params).height,(cpi->common).width,
                      (cpi->common).height);
    }
  }
  iVar15 = (cpi->svc).temporal_layer_id;
  if (iVar15 == 0) {
    (cpi->rc).num_col_blscroll_last_tl0 = 0;
    (cpi->rc).num_row_blscroll_last_tl0 = 0;
  }
  if ((cpi->rc).rtc_external_ratectrl == 0) {
    iVar39 = (cpi->resize_pending_params).width;
    if ((((iVar39 == 0) || (iVar35 = (cpi->resize_pending_params).height, iVar35 == 0)) ||
        (((cpi->common).width == iVar39 && ((cpi->common).height == iVar35)))) &&
       ((cpi->rc).high_source_sad == 0)) {
      if (iVar15 != 0 || (cpi->rc).frames_till_gf_update_due != 0) goto LAB_0020464d;
    }
    else if (iVar15 != 0) goto LAB_0020464d;
    if ((cpi->svc).spatial_layer_id == 0) {
      set_baseline_gf_interval(cpi,*pbVar41);
    }
  }
LAB_0020464d:
  aVar3 = (cpi->oxcf).rc_cfg.mode;
  if (aVar3 == AOM_CBR) {
    if ((*pbVar41 & 0xfd) == 0) {
      iVar15 = av1_calc_iframe_target_size_one_pass_cbr(cpi);
    }
    else {
      iVar15 = av1_calc_pframe_target_size_one_pass_cbr
                         (cpi,(local_100->gf_group).update_type[cpi->gf_frame_index]);
    }
  }
  else if ((*pbVar41 & 0xfd) == 0) {
    lVar19 = (long)(cpi->rc).avg_frame_bandwidth;
    lVar32 = lVar19 * 0x19;
    uVar36 = (ulong)(cpi->oxcf).rc_cfg.max_intra_bitrate_pct;
    if ((uVar36 != 0) && (lVar19 = (long)(uVar36 * lVar19) / 100, lVar19 < lVar32)) {
      lVar32 = lVar19;
    }
    lVar19 = (long)(cpi->rc).max_frame_bandwidth;
    if (lVar32 < lVar19) {
      lVar19 = lVar32;
    }
    iVar15 = (int)lVar19;
  }
  else {
    iVar15 = av1_calc_pframe_target_size_one_pass_vbr
                       (cpi,(local_100->gf_group).update_type[cpi->gf_frame_index]);
  }
  if (aVar3 == AOM_Q) {
    (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
  }
  av1_rc_set_frame_target(cpi,iVar15,(cpi->common).width,(cpi->common).height);
  (cpi->rc).base_frame_target = iVar15;
  (cpi->common).current_frame.frame_type = *pbVar41;
  if ((((cpi->ppi->use_svc != 0) && ((cpi->svc).use_flexible_mode == 0)) &&
      ((cpi->svc).ksvc_fixed_mode != 0)) &&
     ((1 < (cpi->svc).number_spatial_layers &&
      ((cpi->svc).layer_context[(int)lVar38].is_key_frame == 0)))) {
    *(byte *)&(cpi->ext_flags).ref_frame_flags = (byte)(cpi->ext_flags).ref_frame_flags ^ 8;
  }
  return;
}

Assistant:

void av1_get_one_pass_rt_params(AV1_COMP *cpi, FRAME_TYPE *const frame_type,
                                const EncodeFrameInput *frame_input,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  SVC *const svc = &cpi->svc;
  ResizePendingParams *const resize_pending_params =
      &cpi->resize_pending_params;
  int target;
  const int layer =
      LAYER_IDS_TO_IDX(svc->spatial_layer_id, svc->temporal_layer_id,
                       svc->number_temporal_layers);
  if (cpi->oxcf.rc_cfg.max_consec_drop_ms > 0) {
    double framerate =
        cpi->framerate > 1 ? round(cpi->framerate) : cpi->framerate;
    rc->max_consec_drop = saturate_cast_double_to_int(
        ceil(cpi->oxcf.rc_cfg.max_consec_drop_ms * framerate / 1000));
  }
  if (cpi->ppi->use_svc) {
    av1_update_temporal_layer_framerate(cpi);
    av1_restore_layer_context(cpi);
  }
  cpi->ppi->rtc_ref.bias_recovery_frame = set_flag_rps_bias_recovery_frame(cpi);
  // Set frame type.
  if (set_key_frame(cpi, frame_flags)) {
    *frame_type = KEY_FRAME;
    p_rc->this_key_frame_forced =
        cm->current_frame.frame_number != 0 && rc->frames_to_key == 0;
    rc->frames_to_key = cpi->oxcf.kf_cfg.key_freq_max;
    p_rc->kf_boost = DEFAULT_KF_BOOST_RT;
    gf_group->update_type[cpi->gf_frame_index] = KF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = KEY_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_RESET;
    if (cpi->ppi->use_svc) {
      if (cm->current_frame.frame_number > 0)
        av1_svc_reset_temporal_layers(cpi, 1);
      svc->layer_context[layer].is_key_frame = 1;
    }
    rc->frame_number_encoded = 0;
    cpi->ppi->rtc_ref.non_reference_frame = 0;
    rc->static_since_last_scene_change = 0;
  } else {
    *frame_type = INTER_FRAME;
    gf_group->update_type[cpi->gf_frame_index] = LF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = INTER_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_UPDATE;
    if (cpi->ppi->use_svc) {
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      lc->is_key_frame =
          svc->spatial_layer_id == 0
              ? 0
              : svc->layer_context[svc->temporal_layer_id].is_key_frame;
    }
    // If the user is setting the reference structure with
    // set_ref_frame_config and did not set any references, set the
    // frame type to Intra-only.
    if (cpi->ppi->rtc_ref.set_ref_frame_config) {
      int no_references_set = 1;
      for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        if (cpi->ppi->rtc_ref.reference[i]) {
          no_references_set = 0;
          break;
        }
      }

      // Set to intra_only_frame if no references are set.
      // The stream can start decoding on INTRA_ONLY_FRAME so long as the
      // layer with the intra_only_frame doesn't signal a reference to a slot
      // that hasn't been set yet.
      if (no_references_set) *frame_type = INTRA_ONLY_FRAME;
    }
  }
  if (cpi->active_map.enabled && cpi->rc.percent_blocks_inactive == 100) {
    rc->frame_source_sad = 0;
    rc->avg_source_sad = (3 * rc->avg_source_sad + rc->frame_source_sad) >> 2;
    rc->percent_blocks_with_motion = 0;
    rc->high_source_sad = 0;
  } else if (cpi->sf.rt_sf.check_scene_detection &&
             svc->spatial_layer_id == 0) {
    if (rc->prev_coded_width == cm->width &&
        rc->prev_coded_height == cm->height) {
      rc_scene_detection_onepass_rt(cpi, frame_input);
    } else {
      aom_free(cpi->src_sad_blk_64x64);
      cpi->src_sad_blk_64x64 = NULL;
    }
  }
  if (((*frame_type == KEY_FRAME && cpi->sf.rt_sf.rc_adjust_keyframe) ||
       (cpi->sf.rt_sf.rc_compute_spatial_var_sc && rc->high_source_sad)) &&
      svc->spatial_layer_id == 0 && cm->seq_params->bit_depth == 8 &&
      cpi->oxcf.rc_cfg.max_intra_bitrate_pct > 0)
    rc_spatial_act_onepass_rt(cpi, frame_input->source->y_buffer,
                              frame_input->source->y_stride);
  // Check for dynamic resize, for single spatial layer for now.
  // For temporal layers only check on base temporal layer.
  if (cpi->oxcf.resize_cfg.resize_mode == RESIZE_DYNAMIC) {
    if (svc->number_spatial_layers == 1 && svc->temporal_layer_id == 0)
      dynamic_resize_one_pass_cbr(cpi);
    if (rc->resize_state == THREE_QUARTER) {
      resize_pending_params->width = (3 + cpi->oxcf.frm_dim_cfg.width * 3) >> 2;
      resize_pending_params->height =
          (3 + cpi->oxcf.frm_dim_cfg.height * 3) >> 2;
    } else if (rc->resize_state == ONE_HALF) {
      resize_pending_params->width = (1 + cpi->oxcf.frm_dim_cfg.width) >> 1;
      resize_pending_params->height = (1 + cpi->oxcf.frm_dim_cfg.height) >> 1;
    } else {
      resize_pending_params->width = cpi->oxcf.frm_dim_cfg.width;
      resize_pending_params->height = cpi->oxcf.frm_dim_cfg.height;
    }
  } else if (is_frame_resize_pending(cpi)) {
    resize_reset_rc(cpi, resize_pending_params->width,
                    resize_pending_params->height, cm->width, cm->height);
  }
  if (svc->temporal_layer_id == 0) {
    rc->num_col_blscroll_last_tl0 = 0;
    rc->num_row_blscroll_last_tl0 = 0;
  }
  // Set the GF interval and update flag.
  if (!rc->rtc_external_ratectrl)
    set_gf_interval_update_onepass_rt(cpi, *frame_type);
  // Set target size.
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_cbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_cbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  } else {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_vbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_vbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  }
  if (cpi->oxcf.rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = cpi->oxcf.rc_cfg.cq_level;

  av1_rc_set_frame_target(cpi, target, cm->width, cm->height);
  rc->base_frame_target = target;
  cm->current_frame.frame_type = *frame_type;
  // For fixed mode SVC: if KSVC is enabled remove inter layer
  // prediction on spatial enhancement layer frames for frames
  // whose base is not KEY frame.
  if (cpi->ppi->use_svc && !svc->use_flexible_mode && svc->ksvc_fixed_mode &&
      svc->number_spatial_layers > 1 &&
      !svc->layer_context[layer].is_key_frame) {
    ExternalFlags *const ext_flags = &cpi->ext_flags;
    ext_flags->ref_frame_flags ^= AOM_GOLD_FLAG;
  }
}